

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O1

void __thiscall Spi::flash_write_enable(Spi *this)

{
  undefined8 in_RAX;
  uint8_t data [1];
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  if (this->verbose == true) {
    fwrite("status before enable:\n",0x16,1,_stdout);
    flash_read_status(this);
  }
  if (this->verbose == true) {
    fwrite("write enable..\n",0xf,1,_stdout);
  }
  uStack_18 = CONCAT17(6,(undefined7)uStack_18);
  set_gpio(this,0,0);
  xfer_spi(this,(uint8_t *)((long)&uStack_18 + 7),1);
  set_gpio(this,1,0);
  if (this->verbose == true) {
    fwrite("status after enable:\n",0x15,1,_stdout);
    flash_read_status(this);
  }
  return;
}

Assistant:

void Spi::flash_write_enable() {
	if (verbose) {
		fprintf(stdout, "status before enable:\n");
		flash_read_status();
	}

	if (verbose)
		fprintf(stdout, "write enable..\n");

	uint8_t data[1] = { FC_WE };
	flash_chip_select();
	xfer_spi(data, 1);
	flash_chip_deselect();

	if (verbose) {
		fprintf(stdout, "status after enable:\n");
		flash_read_status();
	}
}